

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

void cashew::ValueBuilder::appendToObjectAsSetter(Ref array,IString key,IString param,Ref value)

{
  bool bVar1;
  Ref *pRVar2;
  Value *this;
  Value *pVVar3;
  Value *pVVar4;
  Ref RVar5;
  Ref local_58;
  Ref local_50;
  Ref local_48;
  Ref local_40;
  Ref local_38;
  Ref value_local;
  IString param_local;
  IString key_local;
  Ref array_local;
  
  param_local.str._M_len = (size_t)param.str._M_str;
  value_local.inst = (Value *)param.str._M_len;
  key_local.str._M_len = (size_t)key.str._M_str;
  param_local.str._M_str = (char *)key.str._M_len;
  local_38.inst = value.inst;
  key_local.str._M_str = (char *)array.inst;
  pRVar2 = Ref::operator[]((Ref *)&key_local.str._M_str,0);
  bVar1 = Ref::operator==(pRVar2,(IString *)OBJECT);
  if (!bVar1) {
    __assert_fail("array[0] == OBJECT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                  ,0x743,
                  "static void cashew::ValueBuilder::appendToObjectAsSetter(Ref, IString, IString, Ref)"
                 );
  }
  pRVar2 = Ref::operator[]((Ref *)&key_local.str._M_str,1);
  this = Ref::operator->(pRVar2);
  local_48 = makeRawArray(2);
  pVVar3 = Ref::operator->(&local_48);
  local_58 = makeRawArray(3);
  pVVar4 = Ref::operator->(&local_58);
  RVar5 = makeRawString((IString *)SETTER);
  pVVar4 = cashew::Value::push_back(pVVar4,RVar5);
  RVar5 = makeRawString((IString *)&param_local.str._M_str);
  pVVar4 = cashew::Value::push_back(pVVar4,RVar5);
  RVar5 = makeRawString((IString *)&value_local);
  pVVar4 = cashew::Value::push_back(pVVar4,RVar5);
  Ref::Ref(&local_50,pVVar4);
  pVVar3 = cashew::Value::push_back(pVVar3,local_50);
  pVVar3 = cashew::Value::push_back(pVVar3,local_38);
  Ref::Ref(&local_40,pVVar3);
  cashew::Value::push_back(this,local_40);
  return;
}

Assistant:

static void
  appendToObjectAsSetter(Ref array, IString key, IString param, Ref value) {
    assert(array[0] == OBJECT);
    array[1]->push_back(&makeRawArray(2)
                           ->push_back(&makeRawArray(3)
                                          ->push_back(makeRawString(SETTER))
                                          .push_back(makeRawString(key))
                                          .push_back(makeRawString(param)))
                           .push_back(value));
  }